

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_check_tag(mbedtls_cipher_context_t *ctx,uchar *tag,size_t tag_len)

{
  byte bVar1;
  ulong uStack_50;
  int diff;
  size_t i;
  uchar check_tag [16];
  int ret;
  size_t tag_len_local;
  uchar *tag_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if (((ctx == (mbedtls_cipher_context_t *)0x0) ||
      (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0)) || (ctx->operation != MBEDTLS_DECRYPT)) {
    ctx_local._4_4_ = -0x6100;
  }
  else if (ctx->cipher_info->mode == MBEDTLS_MODE_GCM) {
    if (tag_len < 0x11) {
      ctx_local._4_4_ =
           mbedtls_gcm_finish((mbedtls_gcm_context *)ctx->cipher_ctx,(uchar *)&i,tag_len);
      if (ctx_local._4_4_ == 0) {
        bVar1 = 0;
        for (uStack_50 = 0; uStack_50 < tag_len; uStack_50 = uStack_50 + 1) {
          bVar1 = tag[uStack_50] ^ check_tag[uStack_50 - 8] | bVar1;
        }
        if (bVar1 == 0) {
          ctx_local._4_4_ = 0;
        }
        else {
          ctx_local._4_4_ = -0x6300;
        }
      }
    }
    else {
      ctx_local._4_4_ = -0x6100;
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_check_tag( mbedtls_cipher_context_t *ctx,
                      const unsigned char *tag, size_t tag_len )
{
    int ret;

    if( NULL == ctx || NULL == ctx->cipher_info ||
        MBEDTLS_DECRYPT != ctx->operation )
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
    {
        unsigned char check_tag[16];
        size_t i;
        int diff;

        if( tag_len > sizeof( check_tag ) )
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

        if( 0 != ( ret = mbedtls_gcm_finish( (mbedtls_gcm_context *) ctx->cipher_ctx,
                                     check_tag, tag_len ) ) )
        {
            return( ret );
        }

        /* Check the tag in "constant-time" */
        for( diff = 0, i = 0; i < tag_len; i++ )
            diff |= tag[i] ^ check_tag[i];

        if( diff != 0 )
            return( MBEDTLS_ERR_CIPHER_AUTH_FAILED );

        return( 0 );
    }

    return( 0 );
}